

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::Resize
          (TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_> *this,
          hash_t nhsize)

{
  undefined8 *puVar1;
  uint uVar2;
  Node *block;
  undefined8 uVar3;
  undefined8 uVar4;
  Node *pNVar5;
  long lVar6;
  
  uVar2 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar2 != 0) {
    lVar6 = 0;
    do {
      if (*(long *)((long)&block->Next + lVar6) != 1) {
        pNVar5 = NewKey(this,*(int *)((long)&(block->Pair).Key + lVar6));
        puVar1 = (undefined8 *)((long)&(block->Pair).Value.type + lVar6);
        uVar3 = *puVar1;
        uVar4 = puVar1[1];
        (pNVar5->Pair).Value.type = (int)uVar3;
        (pNVar5->Pair).Value.periodmin = (int)((ulong)uVar3 >> 0x20);
        (pNVar5->Pair).Value.periodmax = (int)uVar4;
        (pNVar5->Pair).Value.volume = (float)(int)((ulong)uVar4 >> 0x20);
        (pNVar5->Pair).Value.attenuation =
             *(float *)((long)&(block->Pair).Value.attenuation + lVar6);
        (pNVar5->Pair).Value.sound.ID = *(int *)((long)&(block->Pair).Value.sound.ID + lVar6);
      }
      lVar6 = lVar6 + 0x28;
    } while ((ulong)uVar2 * 0x28 != lVar6);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}